

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

int tree_5_3::preOrder(Btree t)

{
  long *plVar1;
  long lVar2;
  ostream *poVar3;
  node *pnVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  Btree pnVar9;
  undefined8 *puVar10;
  Btree pnVar11;
  long lVar12;
  long alStack_2d8 [22];
  char *pcStack_228;
  long lStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  code *pcStack_208;
  int aiStack_200 [24];
  long alStack_1a0 [22];
  char *pcStack_f0;
  long lStack_e8;
  Btree stack [22];
  
  lVar12 = -1;
  do {
    lVar2 = lVar12 << 0x20;
    lVar12 = (long)(int)lVar12 + -1;
    for (; t != (Btree)0x0; t = t->left) {
      stack[lVar12 + 2] = t;
      lVar12 = lVar12 + 1;
      lVar2 = lVar2 + 0x100000000;
    }
    lVar2 = *(long *)((long)stack + (lVar2 >> 0x1d));
    printf("%c\t",(ulong)*(uint *)(lVar2 + 0x10));
    t = *(Btree *)(lVar2 + 8);
  } while ((lVar12 != -1) || (t != (Btree)0x0));
  puVar10 = (undefined8 *)0xa;
  putchar(10);
  lStack_e8 = lVar12;
  pcStack_f0 = "%c\t";
  pcStack_208 = (code *)0xffffffffffffffff;
  uVar7 = 0xffffffffffffffff;
  do {
    lVar5 = (long)(int)uVar7;
    lVar12 = lVar5 << 0x20;
    while( true ) {
      lVar5 = lVar5 + 1;
      if (puVar10 == (undefined8 *)0x0) break;
      alStack_1a0[lVar5] = (long)puVar10;
      aiStack_200[lVar5] = 0;
      puVar10 = (undefined8 *)*puVar10;
      lVar12 = lVar12 + 0x100000000;
      uVar7 = (ulong)((int)uVar7 + 1);
    }
    lVar5 = *(long *)((long)alStack_1a0 + (lVar12 >> 0x1d));
    if (*(int *)((long)aiStack_200 + (lVar12 >> 0x1e)) == 0) {
      aiStack_200[lVar12 >> 0x20] = 1;
      puVar10 = *(undefined8 **)(lVar5 + 8);
    }
    else {
      uVar7 = (ulong)((int)uVar7 - 1);
      pcStack_208 = (code *)0x10259c;
      printf("%c\t",(ulong)*(uint *)(lVar5 + 0x10));
      puVar10 = (undefined8 *)0x0;
    }
  } while (((int)uVar7 != -1) || (puVar10 != (undefined8 *)0x0));
  lVar12 = 10;
  pcStack_208 = layorOrder;
  putchar(10);
  pcStack_208 = (code *)uVar7;
  uStack_210 = 0x100000000;
  uStack_218 = 0x100000000;
  lStack_220 = lVar2;
  pcStack_228 = "%c\t";
  if (lVar12 != 0) {
    iVar6 = 0;
    for (lVar12 = -1; lVar2 = (long)iVar6, lVar12 < lVar2; lVar12 = lVar12 + 1) {
      plVar1 = (long *)alStack_2d8[lVar12 + 1];
      printf("%c\t",(ulong)*(uint *)(plVar1 + 2));
      if (*plVar1 != 0) {
        iVar6 = iVar6 + 1;
        alStack_2d8[lVar2 + 1] = *plVar1;
      }
      if (plVar1[1] != 0) {
        lVar2 = (long)iVar6;
        iVar6 = iVar6 + 1;
        alStack_2d8[lVar2 + 1] = plVar1[1];
      }
    }
  }
  pnVar9 = (Btree)0x1040b0;
  poVar3 = std::operator<<((ostream *)&std::cout,"");
  std::endl<char,std::char_traits<char>>(poVar3);
  pnVar11 = *(Btree *)poVar3;
  toThread(pnVar11,pnVar9);
  toThread(pnVar11,(Btree)0x0);
  pnVar9 = (Btree)(ulong)(uint)pnVar11->data;
  printf("%c\t");
  pnVar11 = pnVar11->left;
  preOrderTraverse(pnVar11);
  pnVar4 = pnVar11->left;
  inOrderTraverse((tree_5_3 *)pnVar4,pnVar9);
  pnVar4 = pnVar4->left;
  postOrderTraverse((tree_5_3 *)pnVar4,pnVar9);
  for (; pnVar4 != (node *)0x0; pnVar4 = pnVar4->left) {
    iVar6 = pnVar4->data;
    iVar8 = (int)pnVar9;
    if (iVar6 == iVar8) goto LAB_001026a6;
    if (iVar6 <= iVar8) {
      if (iVar8 <= iVar6) break;
      pnVar4 = (node *)&pnVar4->right;
    }
  }
  pnVar4 = (node *)0x0;
LAB_001026a6:
  return (int)pnVar4;
}

Assistant:

int preOrder(Btree t) {
        Btree p = t, stack[22];
        int top = -1;
        do {
            while (p != nullptr) {
                stack[++top] = p;
                p = p->left;
            }
            p = stack[top--];
            printf("%c\t", p->data);
            p = p->right;
        } while (top != -1 || p != nullptr);
        puts("");
    }